

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O0

bool mocker::detail::runOptPassImpl<mocker::PromoteGlobalVariables>
               (Module *module,ModulePass *param_2)

{
  bool bVar1;
  PromoteGlobalVariables local_d0;
  ModulePass *local_18;
  ModulePass *param_1_local;
  Module *module_local;
  
  local_18 = param_2;
  param_1_local = (ModulePass *)module;
  PromoteGlobalVariables::PromoteGlobalVariables(&local_d0,module);
  bVar1 = PromoteGlobalVariables::operator()(&local_d0);
  PromoteGlobalVariables::~PromoteGlobalVariables(&local_d0);
  return bVar1;
}

Assistant:

bool runOptPassImpl(ir::Module &module, ModulePass *, Args &&... args) {
  return Pass{module, std::forward<Args>(args)...}();
}